

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executionengine.cpp
# Opt level: O2

void __thiscall ExecutionEngine::i_lreturn(ExecutionEngine *this)

{
  VMStack *this_00;
  Frame *pFVar1;
  anon_union_8_10_52016fac_for_data extraout_RDX;
  Value operand;
  Value VVar2;
  
  this_00 = VMStack::getInstance();
  pFVar1 = VMStack::getTopFrame(this_00);
  operand = Frame::popTopOfOperandStack(pFVar1);
  if (operand.type != LONG) {
    __assert_fail("returnValue.type == ValueType::LONG",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/gabepk[P]jvm/src/executionengine.cpp"
                  ,0xd84,"void ExecutionEngine::i_lreturn()");
  }
  VVar2 = Frame::popTopOfOperandStack(pFVar1);
  if ((VVar2._0_8_ & 0xffffffff00000000) == 0xa00000000) {
    VMStack::destroyTopFrame(this_00);
    pFVar1 = VMStack::getTopFrame(this_00);
    VVar2.data.longValue = extraout_RDX.longValue;
    VVar2.printType = BOOLEAN;
    VVar2.type = PADDING;
    Frame::pushIntoOperandStack(pFVar1,VVar2);
    Frame::pushIntoOperandStack(pFVar1,operand);
    return;
  }
  __assert_fail("topFrame->popTopOfOperandStack().type == ValueType::PADDING",
                "/workspace/llm4binary/github/license_all_cmakelists_25/gabepk[P]jvm/src/executionengine.cpp"
                ,0xd85,"void ExecutionEngine::i_lreturn()");
}

Assistant:

void ExecutionEngine::i_lreturn() {
    VMStack &stackFrame = VMStack::getInstance();
    Frame *topFrame = stackFrame.getTopFrame();
    
    Value returnValue = topFrame->popTopOfOperandStack();
    assert(returnValue.type == ValueType::LONG);
    assert(topFrame->popTopOfOperandStack().type == ValueType::PADDING); // o debaixo precisa ser padding
    
    stackFrame.destroyTopFrame();
    
    Frame *newTopFrame = stackFrame.getTopFrame();
    Value padding;
    padding.type = ValueType::PADDING;
    newTopFrame->pushIntoOperandStack(padding);
    newTopFrame->pushIntoOperandStack(returnValue);
}